

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O0

uint __thiscall
llvm::DWARFVerifier::verifyDebugInfoAttribute
          (DWARFVerifier *this,DWARFDie *Die,DWARFAttribute *AttrValue)

{
  ulong uVar1;
  bool bVar2;
  Tag TVar3;
  int iVar4;
  DWARFObject *pDVar5;
  unsigned_long *puVar6;
  undefined4 extraout_var;
  size_t sVar7;
  undefined4 extraout_var_00;
  ArrayRef<unsigned_char> *pAVar8;
  DWARFDebugLoc *this_00;
  LocationList *pLVar9;
  const_iterator pEVar10;
  Optional<unsigned_long> OVar11;
  StringRef local_3b8;
  Twine local_3a8;
  Twine local_390;
  StringRef local_378;
  Twine local_368;
  Twine local_350;
  Twine local_338;
  undefined1 local_320 [8];
  DWARFDie TypeDie;
  Twine local_300;
  Twine local_2e8;
  StringRef local_2d0;
  Twine local_2c0;
  Twine local_2a8;
  StringRef local_290;
  Twine local_280;
  Twine local_268;
  Twine local_250;
  Twine local_238;
  Twine local_220;
  Tag local_204;
  Tag local_202;
  undefined1 auStack_200 [4];
  Tag RefTag;
  Tag DieTag;
  DWARFDie ReferencedDie;
  Entry *Entry;
  const_iterator __end6;
  const_iterator __begin6;
  SmallVector<llvm::DWARFDebugLoc::Entry,_2U> *__range6;
  LocationList *LocList;
  DWARFDebugLoc *DebugLoc;
  Optional<unsigned_long> LocOffset;
  undefined1 local_190 [8];
  Optional<llvm::ArrayRef<unsigned_char>_> Expr;
  anon_class_24_3_3ca02edf VerifyLocationExpr;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long_&>_>_> local_138;
  Twine local_e8;
  Twine local_d0;
  Twine local_b8;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_a0;
  Optional<unsigned_long> SectionOffset_1;
  Twine local_78;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_60;
  Optional<unsigned_long> SectionOffset;
  Attribute Attr;
  DWARFObject *DObj;
  anon_class_24_3_98b65f3c ReportError;
  uint NumErrors;
  DWARFAttribute *AttrValue_local;
  DWARFDie *Die_local;
  DWARFVerifier *this_local;
  
  ReportError.Die._4_4_ = 0;
  DObj = (DWARFObject *)((long)&ReportError.Die + 4);
  ReportError.NumErrors = (uint *)this;
  ReportError.this = (DWARFVerifier *)Die;
  pDVar5 = DWARFContext::getDWARFObj(this->DCtx);
  SectionOffset.Storage._14_2_ = AttrValue->Attr;
  if (SectionOffset.Storage._14_2_ == DW_AT_location) {
    VerifyLocationExpr.this = (DWARFVerifier *)&DObj;
    Expr.Storage._16_8_ = Die;
    VerifyLocationExpr.Die = (DWARFDie *)this;
    DWARFFormValue::getAsBlock
              ((Optional<llvm::ArrayRef<unsigned_char>_> *)local_190,&AttrValue->Value);
    bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)local_190);
    if (bVar2) {
      pAVar8 = Optional<llvm::ArrayRef<unsigned_char>_>::operator*
                         ((Optional<llvm::ArrayRef<unsigned_char>_> *)local_190);
      LocOffset.Storage._8_8_ = pAVar8->Data;
      verifyDebugInfoAttribute::anon_class_24_3_3ca02edf::operator()
                ((anon_class_24_3_3ca02edf *)&Expr.Storage.hasVal,*pAVar8);
    }
    else {
      OVar11 = DWARFFormValue::getAsSectionOffset(&AttrValue->Value);
      DebugLoc = (DWARFDebugLoc *)OVar11.Storage.field_0;
      LocOffset.Storage.field_0.empty = OVar11.Storage.hasVal;
      bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&DebugLoc);
      if ((bVar2) &&
         (this_00 = DWARFContext::getDebugLoc(this->DCtx), this_00 != (DWARFDebugLoc *)0x0)) {
        puVar6 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&DebugLoc);
        pLVar9 = DWARFDebugLoc::getLocationListAtOffset(this_00,*puVar6);
        if (pLVar9 != (LocationList *)0x0) {
          __end6 = SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>::begin
                             ((SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void> *)
                              &pLVar9->Entries);
          pEVar10 = SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>::end
                              ((SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void> *)
                               &pLVar9->Entries);
          for (; __end6 != pEVar10; __end6 = __end6 + 1) {
            ArrayRef<unsigned_char>::ArrayRef<void>
                      ((ArrayRef<unsigned_char> *)&ReferencedDie.Die,
                       (SmallVectorTemplateCommon<unsigned_char,_void> *)&__end6->Loc);
            verifyDebugInfoAttribute::anon_class_24_3_3ca02edf::operator()
                      ((anon_class_24_3_3ca02edf *)&Expr.Storage.hasVal,stack0xfffffffffffffe10);
          }
        }
      }
    }
  }
  else if (SectionOffset.Storage._14_2_ == DW_AT_stmt_list) {
    OVar11 = DWARFFormValue::getAsSectionOffset(&AttrValue->Value);
    local_a0 = OVar11.Storage.field_0;
    SectionOffset_1.Storage.field_0.empty = OVar11.Storage.hasVal;
    bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&local_a0.empty);
    if (bVar2) {
      puVar6 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&local_a0);
      uVar1 = *puVar6;
      iVar4 = (*pDVar5->_vptr_DWARFObject[0xf])();
      sVar7 = StringRef::size((StringRef *)CONCAT44(extraout_var_00,iVar4));
      if (sVar7 <= uVar1) {
        Twine::Twine(&local_d0,"DW_AT_stmt_list offset is beyond .debug_line bounds: ");
        puVar6 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&local_a0);
        formatv<unsigned_long_&>(&local_138,"{0:x8}",puVar6);
        Twine::Twine(&local_e8,&local_138.super_formatv_object_base);
        llvm::operator+(&local_b8,&local_d0,&local_e8);
        verifyDebugInfoAttribute::anon_class_24_3_98b65f3c::operator()
                  ((anon_class_24_3_98b65f3c *)&DObj,&local_b8);
        formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long_&>_>_>::
        ~formatv_object(&local_138);
      }
    }
    else {
      Twine::Twine((Twine *)&VerifyLocationExpr.ReportError,
                   "DIE has invalid DW_AT_stmt_list encoding:");
      verifyDebugInfoAttribute::anon_class_24_3_98b65f3c::operator()
                ((anon_class_24_3_98b65f3c *)&DObj,(Twine *)&VerifyLocationExpr.ReportError);
    }
  }
  else if ((SectionOffset.Storage._14_2_ == DW_AT_abstract_origin) ||
          (SectionOffset.Storage._14_2_ == DW_AT_specification)) {
    _auStack_200 = DWARFDie::getAttributeValueAsReferencedDie(Die,SectionOffset.Storage._14_2_);
    bVar2 = DWARFDie::operator_cast_to_bool((DWARFDie *)auStack_200);
    if (bVar2) {
      local_202 = DWARFDie::getTag(Die);
      local_204 = DWARFDie::getTag((DWARFDie *)auStack_200);
      if ((((local_202 != local_204) &&
           ((local_202 != DW_TAG_inlined_subroutine || (local_204 != DW_TAG_subprogram)))) &&
          ((local_202 != DW_TAG_variable || (local_204 != DW_TAG_member)))) &&
         ((local_202 != DW_TAG_GNU_call_site || (local_204 != DW_TAG_subprogram)))) {
        local_290 = dwarf::TagString((uint)local_202);
        llvm::operator+(&local_280,"DIE with tag ",&local_290);
        Twine::Twine(&local_2a8," has ");
        llvm::operator+(&local_268,&local_280,&local_2a8);
        local_2d0 = dwarf::AttributeString((uint)(ushort)SectionOffset.Storage._14_2_);
        Twine::Twine(&local_2c0,&local_2d0);
        llvm::operator+(&local_250,&local_268,&local_2c0);
        Twine::Twine(&local_2e8," that points to DIE with incompatible tag ");
        llvm::operator+(&local_238,&local_250,&local_2e8);
        join_0x00000010_0x00000000_ = dwarf::TagString((uint)local_204);
        Twine::Twine(&local_300,(StringRef *)&TypeDie.Die);
        llvm::operator+(&local_220,&local_238,&local_300);
        verifyDebugInfoAttribute::anon_class_24_3_98b65f3c::operator()
                  ((anon_class_24_3_98b65f3c *)&DObj,&local_220);
      }
    }
  }
  else if (SectionOffset.Storage._14_2_ == DW_AT_type) {
    _local_320 = DWARFDie::getAttributeValueAsReferencedDie(Die,DW_AT_type);
    bVar2 = DWARFDie::operator_cast_to_bool((DWARFDie *)local_320);
    if (bVar2) {
      TVar3 = DWARFDie::getTag((DWARFDie *)local_320);
      bVar2 = dwarf::isType(TVar3);
      if (!bVar2) {
        local_378 = dwarf::AttributeString((uint)(ushort)SectionOffset.Storage._14_2_);
        llvm::operator+(&local_368,"DIE has ",&local_378);
        Twine::Twine(&local_390," with incompatible tag ");
        llvm::operator+(&local_350,&local_368,&local_390);
        TVar3 = DWARFDie::getTag((DWARFDie *)local_320);
        local_3b8 = dwarf::TagString((uint)TVar3);
        Twine::Twine(&local_3a8,&local_3b8);
        llvm::operator+(&local_338,&local_350,&local_3a8);
        verifyDebugInfoAttribute::anon_class_24_3_98b65f3c::operator()
                  ((anon_class_24_3_98b65f3c *)&DObj,&local_338);
      }
    }
  }
  else if (SectionOffset.Storage._14_2_ == DW_AT_ranges) {
    OVar11 = DWARFFormValue::getAsSectionOffset(&AttrValue->Value);
    local_60 = OVar11.Storage.field_0;
    SectionOffset.Storage.field_0.empty = OVar11.Storage.hasVal;
    bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&local_60.empty);
    if (bVar2) {
      puVar6 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&local_60);
      uVar1 = *puVar6;
      iVar4 = (*pDVar5->_vptr_DWARFObject[0x12])();
      sVar7 = StringRef::size((StringRef *)CONCAT44(extraout_var,iVar4));
      if (sVar7 <= uVar1) {
        Twine::Twine(&local_78,"DW_AT_ranges offset is beyond .debug_ranges bounds:");
        verifyDebugInfoAttribute::anon_class_24_3_98b65f3c::operator()
                  ((anon_class_24_3_98b65f3c *)&DObj,&local_78);
      }
    }
    else {
      Twine::Twine((Twine *)&SectionOffset_1.Storage.hasVal,"DIE has invalid DW_AT_ranges encoding:"
                  );
      verifyDebugInfoAttribute::anon_class_24_3_98b65f3c::operator()
                ((anon_class_24_3_98b65f3c *)&DObj,(Twine *)&SectionOffset_1.Storage.hasVal);
    }
  }
  return ReportError.Die._4_4_;
}

Assistant:

unsigned DWARFVerifier::verifyDebugInfoAttribute(const DWARFDie &Die,
                                                 DWARFAttribute &AttrValue) {
  unsigned NumErrors = 0;
  auto ReportError = [&](const Twine &TitleMsg) {
    ++NumErrors;
    error() << TitleMsg << '\n';
    dump(Die) << '\n';
  };

  const DWARFObject &DObj = DCtx.getDWARFObj();
  const auto Attr = AttrValue.Attr;
  switch (Attr) {
  case DW_AT_ranges:
    // Make sure the offset in the DW_AT_ranges attribute is valid.
    if (auto SectionOffset = AttrValue.Value.getAsSectionOffset()) {
      if (*SectionOffset >= DObj.getRangesSection().Data.size())
        ReportError("DW_AT_ranges offset is beyond .debug_ranges bounds:");
      break;
    }
    ReportError("DIE has invalid DW_AT_ranges encoding:");
    break;
  case DW_AT_stmt_list:
    // Make sure the offset in the DW_AT_stmt_list attribute is valid.
    if (auto SectionOffset = AttrValue.Value.getAsSectionOffset()) {
      if (*SectionOffset >= DObj.getLineSection().Data.size())
        ReportError("DW_AT_stmt_list offset is beyond .debug_line bounds: " +
                    llvm::formatv("{0:x8}", *SectionOffset));
      break;
    }
    ReportError("DIE has invalid DW_AT_stmt_list encoding:");
    break;
  case DW_AT_location: {
    auto VerifyLocationExpr = [&](ArrayRef<uint8_t> D) {
      DWARFUnit *U = Die.getDwarfUnit();
      DataExtractor Data(toStringRef(D), DCtx.isLittleEndian(), 0);
      DWARFExpression Expression(Data, U->getVersion(),
                                 U->getAddressByteSize());
      bool Error = llvm::any_of(Expression, [](DWARFExpression::Operation &Op) {
        return Op.isError();
      });
      if (Error || !Expression.verify(U))
        ReportError("DIE contains invalid DWARF expression:");
    };
    if (Optional<ArrayRef<uint8_t>> Expr = AttrValue.Value.getAsBlock()) {
      // Verify inlined location.
      VerifyLocationExpr(*Expr);
    } else if (auto LocOffset = AttrValue.Value.getAsSectionOffset()) {
      // Verify location list.
      if (auto DebugLoc = DCtx.getDebugLoc())
        if (auto LocList = DebugLoc->getLocationListAtOffset(*LocOffset))
          for (const auto &Entry : LocList->Entries)
            VerifyLocationExpr(Entry.Loc);
    }
    break;
  }
  case DW_AT_specification:
  case DW_AT_abstract_origin: {
    if (auto ReferencedDie = Die.getAttributeValueAsReferencedDie(Attr)) {
      auto DieTag = Die.getTag();
      auto RefTag = ReferencedDie.getTag();
      if (DieTag == RefTag)
        break;
      if (DieTag == DW_TAG_inlined_subroutine && RefTag == DW_TAG_subprogram)
        break;
      if (DieTag == DW_TAG_variable && RefTag == DW_TAG_member)
        break;
      // This might be reference to a function declaration.
      if (DieTag == DW_TAG_GNU_call_site && RefTag == DW_TAG_subprogram)
        break;
      ReportError("DIE with tag " + TagString(DieTag) + " has " +
                  AttributeString(Attr) +
                  " that points to DIE with "
                  "incompatible tag " +
                  TagString(RefTag));
    }
    break;
  }
  case DW_AT_type: {
    DWARFDie TypeDie = Die.getAttributeValueAsReferencedDie(DW_AT_type);
    if (TypeDie && !isType(TypeDie.getTag())) {
      ReportError("DIE has " + AttributeString(Attr) +
                  " with incompatible tag " + TagString(TypeDie.getTag()));
    }
    break;
  }
  default:
    break;
  }
  return NumErrors;
}